

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

void __thiscall
wasm::TranslateToFuzzReader::recombine(wasm::Function*)::Modder::visitExpression(wasm::Expression__
          (void *this,Expression *curr)

{
  long lVar1;
  undefined8 uVar2;
  bool bVar3;
  uint32_t uVar4;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *vec;
  value_type *ppEVar5;
  key_type pEVar6;
  const_iterator cVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  undefined8 *puVar10;
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  key_type local_58;
  undefined8 uStack_50;
  code *local_48;
  code *local_40;
  key_type local_30;
  
  uVar4 = Random::upTo((Random *)(*(long *)((long)this + 0xe8) + 0x18),10);
  if (uVar4 == 0) {
    bVar3 = canBeArbitrarilyReplaced(*(TranslateToFuzzReader **)((long)this + 0xe8),curr);
    if (bVar3) {
      vec = InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
            ::operator[]((InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                          *)(*(long *)((long)this + 0xe0) + 0xe0),&curr->type);
      if ((vec->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl
          .super__Vector_impl_data._M_start ==
          (vec->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl
          .super__Vector_impl_data._M_finish) {
        __assert_fail("!candidates.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                      ,0x66e,
                      "void wasm::TranslateToFuzzReader::recombine(Function *)::Modder::visitExpression(Expression *)"
                     );
      }
      ppEVar5 = Random::pick<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                          ((Random *)(*(long *)((long)this + 0xe8) + 0x18),vec);
      local_58 = (key_type)0x0;
      uStack_50 = 0;
      local_40 = std::
                 _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/manipulation.h:86:15)>
                 ::_M_invoke;
      local_48 = std::
                 _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/manipulation.h:86:15)>
                 ::_M_manager;
      pEVar6 = (key_type)
               wasm::ExpressionManipulator::flexibleCopy
                         (*ppEVar5,*(undefined8 *)((long)this + 0xd8));
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,3);
      }
      puVar10 = *this;
      lVar1 = *(long *)((long)this + 200);
      if (lVar1 != 0) {
        local_58 = (key_type)*puVar10;
        if (*(long *)(lVar1 + 0xf0) != 0) {
          this_00 = (_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)(lVar1 + 0xd8);
          local_30 = pEVar6;
          cVar7 = std::
                  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(this_00,&local_30);
          if (cVar7.
              super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
              ._M_cur == (__node_type *)0x0) {
            iVar8 = std::
                    _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(this_00,&local_58);
            if (iVar8.
                super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
                ._M_cur != (__node_type *)0x0) {
              pmVar9 = std::__detail::
                       _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)this_00,&local_30);
              uVar2 = *(undefined8 *)
                       ((long)iVar8.
                              super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
                              ._M_cur + 0x18);
              *(undefined8 *)
               &(pmVar9->super__Optional_base<wasm::Function::DebugLocation,_true,_true>)._M_payload
                .super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload =
                   *(undefined8 *)
                    ((long)iVar8.
                           super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
                           ._M_cur + 0x10);
              *(undefined8 *)
               ((long)&(pmVar9->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                       _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>.
                       _M_payload + 8) = uVar2;
              *(undefined8 *)
               ((long)&(pmVar9->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                       _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>.
                       _M_payload._M_value.symbolNameIndex.
                       super__Optional_base<unsigned_int,_true,_true>._M_payload + 4) =
                   *(undefined8 *)
                    ((long)iVar8.
                           super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
                           ._M_cur + 0x20);
            }
          }
        }
        puVar10 = *this;
      }
      *puVar10 = pEVar6;
    }
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
      if (parent.oneIn(10) && parent.canBeArbitrarilyReplaced(curr)) {
        // Replace it!
        auto& candidates = scanner.exprsByType[curr->type];
        assert(!candidates.empty()); // this expression itself must be there
        auto* rep = parent.pick(candidates);
        replaceCurrent(ExpressionManipulator::copy(rep, wasm));
      }
    }